

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O3

int fy_emit_setup(fy_emitter *emit,fy_emitter_cfg *cfg)

{
  char *__s;
  int iVar1;
  fy_diag_cfg *cfg_00;
  fy_diag *diag;
  fy_diag_cfg dcfg;
  fy_diag_cfg local_50;
  
  memset(emit,0,0x558);
  emit->cfg = cfg;
  diag = cfg->diag;
  if (diag == (fy_diag *)0x0) {
    cfg_00 = fy_diag_cfg_from_parser(&local_50,(fy_parser *)0x0);
    diag = fy_diag_create(cfg_00);
    if (diag == (fy_diag *)0x0) {
      return -1;
    }
  }
  else {
    fy_diag_ref(diag);
  }
  emit->diag = diag;
  __s = (emit->ea).inplace;
  memset(__s,0,0x118);
  (emit->ea).emit = emit;
  (emit->ea).accum = __s;
  (emit->ea).alloc = 0x100;
  iVar1 = emit->column;
  (emit->ea).start_col = iVar1;
  (emit->ea).ts = 8;
  (emit->queued_events)._lh.next = &(emit->queued_events)._lh;
  (emit->queued_events)._lh.prev = &(emit->queued_events)._lh;
  emit->state_stack = emit->state_stack_inplace;
  emit->state_stack_alloc = 0x40;
  emit->sc_stack = emit->sc_stack_inplace;
  emit->sc_stack_alloc = 0x10;
  emit->field_0x10 = emit->field_0x10 & 0xfe;
  emit->line = 0;
  emit->column = 0;
  emit->flow_level = 0;
  emit->flags = 0x13;
  emit->state = FYES_NONE;
  (emit->ea).next = 0;
  (emit->ea).utf8_count = 0;
  (emit->ea).col = iVar1;
  emit->s_indent = -1;
  emit->s_flags = 1;
  emit->state_stack_top = 0;
  emit->sc_stack_top = 0;
  return 0;
}

Assistant:

int fy_emit_setup(struct fy_emitter *emit, const struct fy_emitter_cfg *cfg) {
    struct fy_diag_cfg dcfg;
    struct fy_diag *diag;

    memset(emit, 0, sizeof(*emit));

    emit->cfg = cfg;

    diag = cfg->diag;

    if (!diag) {
        diag = fy_diag_create(fy_diag_cfg_from_parser(&dcfg, NULL));
        if (!diag)
            return -1;
    } else
        fy_diag_ref(diag);

    emit->diag = diag;

    fy_emit_accum_init(&emit->ea, emit);
    fy_eventp_list_init(&emit->queued_events);

    emit->state_stack = emit->state_stack_inplace;
    emit->state_stack_alloc = sizeof(emit->state_stack_inplace) / sizeof(emit->state_stack_inplace[0]);

    emit->sc_stack = emit->sc_stack_inplace;
    emit->sc_stack_alloc = sizeof(emit->sc_stack_inplace) / sizeof(emit->sc_stack_inplace[0]);

    fy_emit_reset(emit, false);

    return 0;
}